

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function-c.cpp
# Opt level: O2

void duckdb_cast_function_set_row_error
               (duckdb_function_info info,char *error,idx_t row,duckdb_vector output)

{
  std::__cxx11::string::assign((char *)(info + 8));
  if (output != (duckdb_vector)0x0) {
    duckdb::FlatVector::SetNull((Vector *)output,row,true);
    return;
  }
  return;
}

Assistant:

void duckdb_cast_function_set_row_error(duckdb_function_info info, const char *error, idx_t row, duckdb_vector output) {
	auto &cast_info = *reinterpret_cast<duckdb::CCastExecuteInfo *>(info);
	cast_info.error_message = error;
	if (!output) {
		return;
	}
	auto &output_vector = *reinterpret_cast<duckdb::Vector *>(output);
	duckdb::FlatVector::SetNull(output_vector, row, true);
}